

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exls_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  u_char *__s;
  int iVar6;
  u_char **ppuVar7;
  long lVar8;
  size_t outsz;
  timeval tvs2;
  timeval tvs1;
  daciuk<256> dict;
  timeval tvc2;
  timeval tvc1;
  MAFSA_letter word [1024];
  uint local_24f8;
  uint local_24f4;
  size_t local_24f0;
  MAFSA_automaton local_24e8;
  char *local_24e0;
  timeval local_24d8;
  timeval local_24c8;
  daciuk<256> local_24b8;
  timeval local_2438 [64];
  timeval local_2038 [256];
  MAFSA_letter local_1038 [4104];
  
  MAFSA::daciuk<256>::daciuk(&local_24b8);
  if (urls[0] == (u_char *)0x0) {
    uVar4 = 0;
  }
  else {
    ppuVar7 = urls;
    uVar4 = 0;
    __s = urls[0];
    do {
      ppuVar7 = ppuVar7 + 1;
      sVar1 = strlen((char *)__s);
      memcpy(local_1038,__s,sVar1);
      gettimeofday(local_2038,(__timezone_ptr_t)0x0);
      MAFSA::daciuk<256>::insert(&local_24b8,local_1038,sVar1);
      gettimeofday(local_2438,(__timezone_ptr_t)0x0);
      uVar4 = uVar4 + ((int)local_2438[0].tv_usec - (int)local_2038[0].tv_usec) +
              ((int)local_2438[0].tv_sec - (int)local_2038[0].tv_sec) * 1000000;
      __s = *ppuVar7;
    } while (__s != (u_char *)0x0);
  }
  MAFSA::daciuk<256>::save_to_file(&local_24b8,"xxx");
  local_24e8 = MAFSA_automaton_load_from_binary_file("xxx",(int *)0x0);
  local_24f4 = 0;
  local_24f8 = 0;
  uVar5 = 0;
  do {
    local_24f0 = 0;
    pcVar2 = fgets((char *)local_1038,0x1000,_stdin);
    if (pcVar2 != (char *)0x0) {
      local_24e0 = pcVar2;
      pcVar2 = strchr((char *)local_1038,10);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      pcVar2 = strchr((char *)local_1038,0xd);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar1 = strlen((char *)local_1038);
      gettimeofday(&local_24c8,(__timezone_ptr_t)0x0);
      uVar3 = MAFSA_automaton_search
                        (local_24e8,local_1038,sVar1,(MAFSA_letter *)local_2438,0x400,&local_24f0);
      gettimeofday(&local_24d8,(__timezone_ptr_t)0x0);
      uVar5 = uVar5 + ((int)local_24d8.tv_usec - (int)local_24c8.tv_usec) +
              ((int)local_24d8.tv_sec - (int)local_24c8.tv_sec) * 1000000;
      iVar6 = (int)uVar3;
      if (iVar6 == -1) {
        local_24f8 = local_24f8 + 1;
        pcVar2 = local_24e0;
      }
      else {
        local_24f4 = local_24f4 + 1;
        snprintf((char *)local_2038,(long)(iVar6 + 1),"%s",local_1038);
        lVar8 = (long)iVar6;
        *(undefined8 *)((long)&local_2038[0].tv_sec + lVar8) = 0x6d31333b315b1b;
        snprintf((char *)((long)&local_2038[0].tv_sec + lVar8 + 7),local_24f0 + 1,"%s",local_2438);
        pcVar2 = (char *)((long)&local_2038[0].tv_usec + local_24f0 + lVar8 + 3);
        *(undefined4 *)((long)&local_2038[0].tv_sec + local_24f0 + lVar8 + 7) = 0x6d305b1b;
        *pcVar2 = '\0';
        snprintf(pcVar2,(sVar1 - (local_24f0 + lVar8)) + 1,"%s",local_1038 + local_24f0 + lVar8);
        printf("Filter (%03d .. %03u): %s\n",uVar3 & 0xffffffff,
               (ulong)(uint)(iVar6 + (int)local_24f0),local_2038);
        pcVar2 = local_24e0;
      }
    }
  } while (pcVar2 != (char *)0x0);
  putchar(10);
  printf("Result: ex = %d, ok = %d\n",(ulong)local_24f4,(ulong)local_24f8);
  printf("TimeComple: %6u.%06u seconds\n",(ulong)uVar4 / 1000000,(ulong)(uVar4 % 1000000));
  printf("TimeSearch: %6u.%06u seconds\n",(ulong)uVar5 / 1000000,(ulong)(uVar5 % 1000000));
  MAFSA_automaton_close(local_24e8);
  MAFSA::daciuk<256>::~daciuk(&local_24b8);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    MAFSA::daciuk<MAX_LETTER + 1> dict;
    MAFSA_automaton ma;

    int i;
    int rc;

    uint32_t ex = 0, ok = 0;
    uint32_t cs = 0, ss = 0;

    for (i = 0; urls[i]; ++i)
    {
        size_t sz;
        MAFSA_letter word [1024];

        struct timeval tvc1;
        struct timeval tvc2;

        sz = strlen((const char *) urls[i]);
        memcpy(word, urls[i], sz);

        gettimeofday(&tvc1, NULL);
        dict.insert(word, sz);
        gettimeofday(&tvc2, NULL);

        cs += (tvc2.tv_sec - tvc1.tv_sec) * 1000000 + (tvc2.tv_usec - tvc1.tv_usec);
    }

    dict.save_to_file(SAVE_TO);
    ma = MAFSA_automaton_load_from_binary_file(SAVE_TO, NULL);

    for (;;)
    {
        MAFSA_letter outbuf [1024];
        char urlbuf [4096], *pos;
        size_t outsz = 0, urlsz = 0;

        struct timeval tvs1;
        struct timeval tvs2;

        if (NULL == fgets(urlbuf, 4096, stdin))
        {
            break;
        }

        if (NULL != (pos = strchr(urlbuf, '\n'))) *pos = 0;
        if (NULL != (pos = strchr(urlbuf, '\r'))) *pos = 0;

        urlsz = strlen(urlbuf);

        gettimeofday(&tvs1, NULL);
        rc = MAFSA_automaton_search(ma, (const MAFSA_letter *) urlbuf, urlsz, outbuf, 1024, &outsz);
        gettimeofday(&tvs2, NULL);

        ss += (tvs2.tv_sec - tvs1.tv_sec) * 1000000 + (tvs2.tv_usec - tvs1.tv_usec);

        if (-1 == rc)
        {
            ++ok;
        }
        else
        {
            char dbg [4096];

            ++ex;
            pos = dbg;

            snprintf(pos, rc + 1, "%s", urlbuf);
            pos += rc;

            snprintf(pos, sizeof("\033[1;31m"), "\033[1;31m");
            pos += sizeof("\033[1;31m") - 1;

            snprintf(pos, outsz + 1, "%s", outbuf);
            pos += outsz;

            snprintf(pos, sizeof("\033[0m"), "\033[0m");
            pos += sizeof("\033[0m") - 1;

            snprintf(pos, urlsz - outsz - rc + 1, "%s", urlbuf + rc + outsz);
            printf("Filter (%03d .. %03u): %s\n", rc, (unsigned int) (rc + outsz), dbg);
        }
    }

    printf("\n");
    printf("Result: ex = %d, ok = %d\n", ex, ok);
    printf("TimeComple: %6u.%06u seconds\n", cs / 1000000, cs % 1000000);
    printf("TimeSearch: %6u.%06u seconds\n", ss / 1000000, ss % 1000000);

    MAFSA_automaton_close(ma);

    return 0;
}